

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::TestCase::TestCase
          (TestCase *this,funcType test,char *file,uint line,TestSuite *test_suite,char *type,
          int template_id)

{
  undefined4 in_ECX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  String *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb0;
  
  TestCaseData::TestCaseData((TestCaseData *)0x110ed3);
  String::String((String *)0x110ee5);
  String::String(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  String::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  String::~String(in_stack_ffffffffffffffb0);
  *(undefined4 *)(in_RDI + 0x18) = in_ECX;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = *in_R8;
  *(undefined8 *)(in_RDI + 0x30) = in_R8[1];
  *(byte *)(in_RDI + 0x38) = *(byte *)(in_R8 + 2) & 1;
  *(byte *)(in_RDI + 0x39) = *(byte *)((long)in_R8 + 0x11) & 1;
  *(byte *)(in_RDI + 0x3a) = *(byte *)((long)in_R8 + 0x12) & 1;
  *(byte *)(in_RDI + 0x3b) = *(byte *)((long)in_R8 + 0x13) & 1;
  *(byte *)(in_RDI + 0x3c) = *(byte *)((long)in_R8 + 0x14) & 1;
  *(undefined4 *)(in_RDI + 0x40) = *(undefined4 *)(in_R8 + 3);
  *(undefined8 *)(in_RDI + 0x48) = in_R8[4];
  *(undefined8 *)(in_RDI + 0x50) = in_RSI;
  *(undefined8 *)(in_RDI + 0x58) = in_R9;
  *(undefined4 *)(in_RDI + 0x60) = in_stack_00000008;
  return;
}

Assistant:

TestCase::TestCase(funcType test, const char* file, unsigned line, const TestSuite& test_suite,
                       const char* type, int template_id) {
        m_file              = file;
        m_line              = line;
        m_name              = nullptr; // will be later overridden in operator*
        m_test_suite        = test_suite.m_test_suite;
        m_description       = test_suite.m_description;
        m_skip              = test_suite.m_skip;
        m_no_breaks         = test_suite.m_no_breaks;
        m_no_output         = test_suite.m_no_output;
        m_may_fail          = test_suite.m_may_fail;
        m_should_fail       = test_suite.m_should_fail;
        m_expected_failures = test_suite.m_expected_failures;
        m_timeout           = test_suite.m_timeout;

        m_test        = test;
        m_type        = type;
        m_template_id = template_id;
    }